

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_load_save.cpp
# Opt level: O1

void __thiscall
Am_Load_Save_Context_Data::~Am_Load_Save_Context_Data(Am_Load_Save_Context_Data *this)

{
  uint *puVar1;
  Am_Map_Loader *pAVar2;
  Am_Map_Saver *pAVar3;
  Am_Map_Prototypes *pAVar4;
  Am_Wrapper *pAVar5;
  Am_Map_Names *pAVar6;
  Am_Map_Wrappers *pAVar7;
  Am_Map_References *pAVar8;
  
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002e3d58;
  pAVar2 = this->loader;
  std::
  _Rb_tree<const_char_*,_std::pair<const_char_*const,_Am_Load_Method>,_std::_Select1st<std::pair<const_char_*const,_Am_Load_Method>_>,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_Am_Load_Method>_>_>
  ::_M_erase_aux((_Rb_tree<const_char_*,_std::pair<const_char_*const,_Am_Load_Method>,_std::_Select1st<std::pair<const_char_*const,_Am_Load_Method>_>,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_Am_Load_Method>_>_>
                  *)pAVar2,(pAVar2->mMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (const_iterator)&(pAVar2->mMap)._M_t._M_impl.super__Rb_tree_header);
  pAVar2 = this->loader;
  if (pAVar2 != (Am_Map_Loader *)0x0) {
    std::
    _Rb_tree<const_char_*,_std::pair<const_char_*const,_Am_Load_Method>,_std::_Select1st<std::pair<const_char_*const,_Am_Load_Method>_>,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_Am_Load_Method>_>_>
    ::~_Rb_tree((_Rb_tree<const_char_*,_std::pair<const_char_*const,_Am_Load_Method>,_std::_Select1st<std::pair<const_char_*const,_Am_Load_Method>_>,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_Am_Load_Method>_>_>
                 *)pAVar2);
    operator_delete(pAVar2);
  }
  pAVar3 = this->saver;
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_Am_Save_Method>,_std::_Select1st<std::pair<const_unsigned_short,_Am_Save_Method>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Am_Save_Method>_>_>
  ::_M_erase_aux((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_Am_Save_Method>,_std::_Select1st<std::pair<const_unsigned_short,_Am_Save_Method>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Am_Save_Method>_>_>
                  *)pAVar3,(pAVar3->mMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (const_iterator)&(pAVar3->mMap)._M_t._M_impl.super__Rb_tree_header);
  pAVar3 = this->saver;
  if (pAVar3 != (Am_Map_Saver *)0x0) {
    std::
    _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_Am_Save_Method>,_std::_Select1st<std::pair<const_unsigned_short,_Am_Save_Method>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Am_Save_Method>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_Am_Save_Method>,_std::_Select1st<std::pair<const_unsigned_short,_Am_Save_Method>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Am_Save_Method>_>_>
                 *)pAVar3);
    operator_delete(pAVar3);
  }
  pAVar4 = this->prototypes;
  std::
  _Rb_tree<Name_Num,_std::pair<const_Name_Num,_Wrapper_Holder>,_std::_Select1st<std::pair<const_Name_Num,_Wrapper_Holder>_>,_std::less<Name_Num>,_std::allocator<std::pair<const_Name_Num,_Wrapper_Holder>_>_>
  ::_M_erase_aux((_Rb_tree<Name_Num,_std::pair<const_Name_Num,_Wrapper_Holder>,_std::_Select1st<std::pair<const_Name_Num,_Wrapper_Holder>_>,_std::less<Name_Num>,_std::allocator<std::pair<const_Name_Num,_Wrapper_Holder>_>_>
                  *)pAVar4,(pAVar4->mMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (const_iterator)&(pAVar4->mMap)._M_t._M_impl.super__Rb_tree_header);
  pAVar4 = this->prototypes;
  if (pAVar4 != (Am_Map_Prototypes *)0x0) {
    pAVar5 = (pAVar4->mDefaultReturn).data;
    if (pAVar5 != (Am_Wrapper *)0x0) {
      puVar1 = &pAVar5->refs;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        (*(pAVar5->super_Am_Registered_Type)._vptr_Am_Registered_Type[4])();
      }
    }
    std::
    _Rb_tree<Name_Num,_std::pair<const_Name_Num,_Wrapper_Holder>,_std::_Select1st<std::pair<const_Name_Num,_Wrapper_Holder>_>,_std::less<Name_Num>,_std::allocator<std::pair<const_Name_Num,_Wrapper_Holder>_>_>
    ::~_Rb_tree((_Rb_tree<Name_Num,_std::pair<const_Name_Num,_Wrapper_Holder>,_std::_Select1st<std::pair<const_Name_Num,_Wrapper_Holder>_>,_std::less<Name_Num>,_std::allocator<std::pair<const_Name_Num,_Wrapper_Holder>_>_>
                 *)pAVar4);
    operator_delete(pAVar4);
  }
  pAVar6 = this->names;
  std::
  _Rb_tree<Wrapper_Holder,_std::pair<const_Wrapper_Holder,_Name_Num>,_std::_Select1st<std::pair<const_Wrapper_Holder,_Name_Num>_>,_std::less<Wrapper_Holder>,_std::allocator<std::pair<const_Wrapper_Holder,_Name_Num>_>_>
  ::_M_erase_aux((_Rb_tree<Wrapper_Holder,_std::pair<const_Wrapper_Holder,_Name_Num>,_std::_Select1st<std::pair<const_Wrapper_Holder,_Name_Num>_>,_std::less<Wrapper_Holder>,_std::allocator<std::pair<const_Wrapper_Holder,_Name_Num>_>_>
                  *)pAVar6,(pAVar6->mMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (const_iterator)&(pAVar6->mMap)._M_t._M_impl.super__Rb_tree_header);
  pAVar6 = this->names;
  if (pAVar6 != (Am_Map_Names *)0x0) {
    std::
    _Rb_tree<Wrapper_Holder,_std::pair<const_Wrapper_Holder,_Name_Num>,_std::_Select1st<std::pair<const_Wrapper_Holder,_Name_Num>_>,_std::less<Wrapper_Holder>,_std::allocator<std::pair<const_Wrapper_Holder,_Name_Num>_>_>
    ::~_Rb_tree((_Rb_tree<Wrapper_Holder,_std::pair<const_Wrapper_Holder,_Name_Num>,_std::_Select1st<std::pair<const_Wrapper_Holder,_Name_Num>_>,_std::less<Wrapper_Holder>,_std::allocator<std::pair<const_Wrapper_Holder,_Name_Num>_>_>
                 *)pAVar6);
    operator_delete(pAVar6);
  }
  pAVar7 = this->wrappers;
  std::
  _Rb_tree<int,_std::pair<const_int,_Wrapper_Holder>,_std::_Select1st<std::pair<const_int,_Wrapper_Holder>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Wrapper_Holder>_>_>
  ::_M_erase_aux((_Rb_tree<int,_std::pair<const_int,_Wrapper_Holder>,_std::_Select1st<std::pair<const_int,_Wrapper_Holder>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Wrapper_Holder>_>_>
                  *)pAVar7,(pAVar7->mMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (const_iterator)&(pAVar7->mMap)._M_t._M_impl.super__Rb_tree_header);
  pAVar7 = this->wrappers;
  if (pAVar7 != (Am_Map_Wrappers *)0x0) {
    pAVar5 = (pAVar7->mDefaultReturn).data;
    if (pAVar5 != (Am_Wrapper *)0x0) {
      puVar1 = &pAVar5->refs;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        (*(pAVar5->super_Am_Registered_Type)._vptr_Am_Registered_Type[4])();
      }
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_Wrapper_Holder>,_std::_Select1st<std::pair<const_int,_Wrapper_Holder>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Wrapper_Holder>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_Wrapper_Holder>,_std::_Select1st<std::pair<const_int,_Wrapper_Holder>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Wrapper_Holder>_>_>
                 *)pAVar7);
    operator_delete(pAVar7);
  }
  pAVar8 = this->references;
  std::
  _Rb_tree<Wrapper_Holder,_std::pair<const_Wrapper_Holder,_int>,_std::_Select1st<std::pair<const_Wrapper_Holder,_int>_>,_std::less<Wrapper_Holder>,_std::allocator<std::pair<const_Wrapper_Holder,_int>_>_>
  ::_M_erase_aux((_Rb_tree<Wrapper_Holder,_std::pair<const_Wrapper_Holder,_int>,_std::_Select1st<std::pair<const_Wrapper_Holder,_int>_>,_std::less<Wrapper_Holder>,_std::allocator<std::pair<const_Wrapper_Holder,_int>_>_>
                  *)pAVar8,(pAVar8->mMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (const_iterator)&(pAVar8->mMap)._M_t._M_impl.super__Rb_tree_header);
  pAVar8 = this->references;
  if (pAVar8 != (Am_Map_References *)0x0) {
    std::
    _Rb_tree<Wrapper_Holder,_std::pair<const_Wrapper_Holder,_int>,_std::_Select1st<std::pair<const_Wrapper_Holder,_int>_>,_std::less<Wrapper_Holder>,_std::allocator<std::pair<const_Wrapper_Holder,_int>_>_>
    ::~_Rb_tree((_Rb_tree<Wrapper_Holder,_std::pair<const_Wrapper_Holder,_int>,_std::_Select1st<std::pair<const_Wrapper_Holder,_int>_>,_std::less<Wrapper_Holder>,_std::allocator<std::pair<const_Wrapper_Holder,_int>_>_>
                 *)pAVar8);
    operator_delete(pAVar8);
    return;
  }
  return;
}

Assistant:

Am_Load_Save_Context_Data::~Am_Load_Save_Context_Data()
{
  loader->Clear();
  delete (loader);

  saver->Clear();
  delete (saver);

  prototypes->Clear();
  delete (prototypes);

  names->Clear();
  delete (names);

  wrappers->Clear();
  delete (wrappers);

  references->Clear();
  delete (references);
}